

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::EnterFrame(SQVM *this,SQInteger newbase,SQInteger newtop,bool tailcall)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  SQObjectPtr local_40;
  undefined1 local_29;
  SQInteger SStack_28;
  bool tailcall_local;
  SQInteger newtop_local;
  SQInteger newbase_local;
  SQVM *this_local;
  
  local_29 = tailcall;
  SStack_28 = newtop;
  newtop_local = newbase;
  newbase_local = (SQInteger)this;
  if (tailcall) {
    this->ci->_ncalls = this->ci->_ncalls + 1;
  }
  else {
    if (this->_callsstacksize == this->_alloccallsstacksize) {
      GrowCallStack(this);
    }
    lVar1 = this->_callsstacksize;
    this->_callsstacksize = lVar1 + 1;
    this->ci = this->_callsstack + lVar1;
    this->ci->_prevstkbase = (int)newtop_local - (int)this->_stackbase;
    this->ci->_prevtop = (int)this->_top - (int)this->_stackbase;
    this->ci->_etraps = 0;
    this->ci->_ncalls = 1;
    this->ci->_generator = (SQGenerator *)0x0;
    this->ci->_root = 0;
  }
  this->_stackbase = newtop_local;
  this->_top = SStack_28;
  lVar1 = SStack_28 + 0xf;
  SVar2 = sqvector<SQObjectPtr>::size(&this->_stack);
  if ((long)SVar2 < lVar1) {
    if (this->_nmetamethodscall != 0) {
      Raise_Error(this,"stack overflow, cannot resize stack while in a metamethod");
      return false;
    }
    SVar2 = SStack_28 + 0x3c;
    ::SQObjectPtr::SQObjectPtr(&local_40);
    sqvector<SQObjectPtr>::resize(&this->_stack,SVar2,&local_40);
    ::SQObjectPtr::~SQObjectPtr(&local_40);
    RelocateOuters(this);
  }
  return true;
}

Assistant:

bool SQVM::EnterFrame(SQInteger newbase, SQInteger newtop, bool tailcall)
{
    if( !tailcall ) {
        if( _callsstacksize == _alloccallsstacksize ) {
            GrowCallStack();
        }
        ci = &_callsstack[_callsstacksize++];
        ci->_prevstkbase = (SQInt32)(newbase - _stackbase);
        ci->_prevtop = (SQInt32)(_top - _stackbase);
        ci->_etraps = 0;
        ci->_ncalls = 1;
        ci->_generator = NULL;
        ci->_root = SQFalse;
    }
    else {
        ci->_ncalls++;
    }

    _stackbase = newbase;
    _top = newtop;
    if(newtop + MIN_STACK_OVERHEAD > (SQInteger)_stack.size()) {
        if(_nmetamethodscall) {
            Raise_Error(_SC("stack overflow, cannot resize stack while in a metamethod"));
            return false;
        }
        _stack.resize(newtop + (MIN_STACK_OVERHEAD << 2));
        RelocateOuters();
    }
    return true;
}